

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O0

size_t axl::err::setError(StringRef *string)

{
  size_t sVar1;
  size_t result;
  Error error;
  undefined8 local_58;
  StringRef *in_stack_ffffffffffffffc0;
  Error *in_stack_ffffffffffffffc8;
  
  Error::Error((Error *)0x17bfd8);
  sVar1 = Error::createStringError(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (sVar1 == 0xffffffffffffffff) {
    local_58 = 0xffffffffffffffff;
  }
  else {
    local_58 = setError((ErrorRef *)0x17c00a);
  }
  Error::~Error((Error *)0x17c03f);
  return local_58;
}

Assistant:

size_t
setError(const sl::StringRef& string) {
	Error error;
	size_t result = error.createStringError(string);
	return result != -1 ? setError(error) : -1;
}